

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::verifyWidePointAt
          (PointRenderCase *this,IVec2 *pointPos,Surface *viewport,GeneratedPoint *refPoint,
          IVec4 *bbox,ResultPointType pointType,int componentNdx,int *logFloodCounter)

{
  pointer *this_00;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  GeneratedPoint *pGVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  int *piVar12;
  TestLog *this_01;
  MessageBuilder *pMVar13;
  bool bVar14;
  bool local_365;
  bool local_359;
  bool local_351;
  Vector<int,_2> *local_310;
  bool local_2d9;
  bool local_2d1;
  Vector<float,_2> local_2b0;
  MessageBuilder local_2a8;
  bool local_127;
  bool local_126;
  byte local_125;
  int local_124;
  bool viewportClipped_1;
  bool bboxClipped_1;
  bool squareFits_2;
  int dy;
  IVec2 unionRange;
  int y_2;
  int ndx_1;
  int ndx;
  bool viewportClipped;
  bool bboxClipped;
  bool squareFits_1;
  IVec2 *range_1;
  value_type local_f8;
  deUint32 local_f0;
  Vector<int,_4> local_ec;
  int local_dc;
  undefined1 local_d8 [4];
  int y_1;
  bool widthClipped;
  undefined8 uStack_d0;
  bool squareFits;
  IVec2 *range;
  undefined1 local_bc [24];
  Vector<int,_4> local_a4;
  undefined4 local_94;
  undefined1 local_90 [4];
  int y;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widths;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsDownwards;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsUpwards;
  BBoxSize local_40;
  bool primitiveClippedBottom;
  bool primitiveClippedTop;
  bool viewportClippedBottom;
  bool viewportClippedTop;
  int expectedPointSize;
  ResultPointType pointType_local;
  IVec4 *bbox_local;
  GeneratedPoint *refPoint_local;
  Surface *viewport_local;
  IVec2 *pointPos_local;
  PointRenderCase *this_local;
  
  local_40 = refPoint->size;
  bVar14 = false;
  bVar1 = false;
  bVar5 = false;
  bVar6 = false;
  _primitiveClippedBottom = pointType;
  _expectedPointSize = (pointer)bbox;
  bbox_local = (IVec4 *)refPoint;
  refPoint_local = (GeneratedPoint *)viewport;
  viewport_local = (Surface *)pointPos;
  pointPos_local = (IVec2 *)this;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
             &widthsDownwards.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
             &widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_90);
  local_94 = tcu::Vector<int,_2>::y((Vector<int,_2> *)viewport_local);
  while ((uVar2 = local_94, iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)_expectedPointSize),
         uVar3 = local_94, iVar7 <= (int)uVar2 && (-1 < (int)local_94))) {
    iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)viewport_local);
    pGVar4 = refPoint_local;
    if ((int)local_40 < iVar7 - local_94) goto LAB_0237be6c;
    iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)viewport_local);
    local_bc._20_4_ = tcu::Surface::getPixel((Surface *)pGVar4,iVar7,local_94);
    tcu::RGBA::toIVec((RGBA *)(local_bc + 0x18));
    piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(local_bc + 0x18),componentNdx);
    if (*piVar12 == 0) goto LAB_0237be6c;
    iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)viewport_local);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&range + 4),iVar7,local_94);
    scanPointWidthAt((PointRenderCase *)local_bc,(IVec2 *)this,(Surface *)((long)&range + 4),
                     (int)refPoint_local,local_40);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
               &widthsDownwards.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_bc);
    local_94 = local_94 + -1;
  }
  iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)_expectedPointSize);
  bVar5 = (int)uVar3 < iVar7;
  bVar14 = (int)local_94 < 0;
LAB_0237be6c:
  if (((bVar14) || ((_primitiveClippedBottom == POINT_PARTIAL && (bVar5)))) &&
     (bVar5 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::empty
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &widthsDownwards.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar5)) {
    uStack_d0 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::back
                          ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                           &widthsDownwards.
                            super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)uStack_d0);
    iVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)uStack_d0);
    y_1._3_1_ = (int)local_40 <= (iVar7 - iVar8) + 1;
    local_2d1 = false;
    if (_primitiveClippedBottom == POINT_PARTIAL) {
      iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)uStack_d0);
      iVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)_expectedPointSize);
      local_2d9 = true;
      if (iVar8 < iVar7) {
        iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)uStack_d0);
        iVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)_expectedPointSize);
        local_2d9 = iVar8 <= iVar7;
      }
      local_2d1 = local_2d9;
    }
    y_1._2_1_ = local_2d1;
    if (((y_1._3_1_ & 1) != 0) || (local_2d1 != false)) {
      this_local._7_1_ = 1;
      goto LAB_0237c81b;
    }
  }
  local_dc = tcu::Vector<int,_2>::y((Vector<int,_2> *)viewport_local);
  while( true ) {
    local_dc = local_dc + 1;
    iVar7 = local_dc;
    iVar9 = tcu::Vector<int,_4>::w((Vector<int,_4> *)_expectedPointSize);
    iVar8 = local_dc;
    if ((iVar9 <= iVar7) ||
       (iVar9 = tcu::Surface::getHeight((Surface *)refPoint_local), iVar7 = local_dc, iVar9 <= iVar8
       )) break;
    iVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)viewport_local);
    pGVar4 = refPoint_local;
    if ((int)local_40 < iVar7 - iVar8) goto LAB_0237c134;
    iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)viewport_local);
    local_f0 = (deUint32)tcu::Surface::getPixel((Surface *)pGVar4,iVar7,local_dc);
    tcu::RGBA::toIVec((RGBA *)&local_ec);
    piVar12 = tcu::Vector<int,_4>::operator[](&local_ec,componentNdx);
    if (*piVar12 == 0) goto LAB_0237c134;
    iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)viewport_local);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&range_1,iVar7,local_dc);
    scanPointWidthAt((PointRenderCase *)&local_f8,(IVec2 *)this,(Surface *)&range_1,
                     (int)refPoint_local,local_40);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
               &widths.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
  }
  iVar7 = local_dc;
  iVar9 = tcu::Vector<int,_4>::w((Vector<int,_4> *)_expectedPointSize);
  iVar8 = local_dc;
  bVar6 = iVar9 <= iVar7;
  iVar7 = tcu::Surface::getHeight((Surface *)refPoint_local);
  bVar1 = iVar7 <= iVar8;
LAB_0237c134:
  if (((bVar1) || ((_primitiveClippedBottom == POINT_PARTIAL && (bVar6)))) &&
     ((bVar6 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::empty
                         ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                          &widths.
                           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar6 ||
      (bVar6 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::empty
                         ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                          &widthsDownwards.
                           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar6)))) {
    bVar6 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::empty
                      ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                       &widths.
                        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar6) {
      local_310 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::front
                            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                             &widthsDownwards.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      local_310 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::back
                            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                             &widths.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    iVar7 = tcu::Vector<int,_2>::y(local_310);
    iVar8 = tcu::Vector<int,_2>::x(local_310);
    bVar6 = (int)local_40 <= (iVar7 - iVar8) + 1;
    bVar1 = false;
    if (_primitiveClippedBottom == POINT_PARTIAL) {
      iVar7 = tcu::Vector<int,_2>::x(local_310);
      iVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)_expectedPointSize);
      bVar1 = true;
      if (iVar8 < iVar7) {
        iVar7 = tcu::Vector<int,_2>::y(local_310);
        iVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)_expectedPointSize);
        bVar1 = iVar8 + -1 <= iVar7;
      }
    }
    iVar7 = tcu::Vector<int,_2>::x(local_310);
    bVar5 = true;
    if (0 < iVar7) {
      iVar7 = tcu::Vector<int,_2>::y(local_310);
      iVar8 = tcu::Surface::getWidth((Surface *)refPoint_local);
      bVar5 = iVar8 + -1 <= iVar7;
    }
    if (((bVar6) || (bVar1)) || (bVar5)) {
      this_local._7_1_ = 1;
      goto LAB_0237c81b;
    }
  }
  for (y_2 = 0; sVar10 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::
                         size((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                              &widthsDownwards.
                               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
      y_2 < (int)sVar10; y_2 = y_2 + 1) {
    this_00 = &widthsDownwards.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar10 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        this_00);
    pvVar11 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         this_00,(long)(~y_2 + (int)sVar10));
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_90,
               pvVar11);
  }
  for (unionRange.m_data[1] = 0; iVar7 = unionRange.m_data[1],
      sVar10 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                         ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                          &widths.
                           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar7 < (int)sVar10;
      unionRange.m_data[1] = unionRange.m_data[1] + 1) {
    pvVar11 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &widths.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)unionRange.m_data[1]);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_90,
               pvVar11);
  }
  for (unionRange.m_data[0] = 0; iVar7 = unionRange.m_data[0],
      sVar10 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                         ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                          local_90), iVar7 < (int)(((int)sVar10 - local_40) + 1);
      unionRange.m_data[0] = unionRange.m_data[0] + 1) {
    pvVar11 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         local_90,(long)unionRange.m_data[0]);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xfffffffffffffee0,pvVar11);
    for (local_124 = 1; local_124 < (int)local_40; local_124 = local_124 + 1) {
      piVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffee0);
      iVar7 = *piVar12;
      pvVar11 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                          ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                           local_90,(long)(unionRange.m_data[0] + local_124));
      piVar12 = tcu::Vector<int,_2>::x(pvVar11);
      iVar7 = de::max<int>(iVar7,*piVar12);
      piVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffee0);
      *piVar12 = iVar7;
      piVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffee0);
      iVar7 = *piVar12;
      pvVar11 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                          ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                           local_90,(long)(unionRange.m_data[0] + local_124));
      piVar12 = tcu::Vector<int,_2>::y(pvVar11);
      iVar7 = de::min<int>(iVar7,*piVar12);
      piVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffee0);
      *piVar12 = iVar7;
    }
    piVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffee0);
    iVar7 = *piVar12;
    piVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffee0);
    local_125 = (int)local_40 <= (iVar7 - *piVar12) + 1;
    local_351 = false;
    if (_primitiveClippedBottom == POINT_PARTIAL) {
      piVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffee0);
      iVar7 = *piVar12;
      iVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)_expectedPointSize);
      local_359 = true;
      if (iVar8 < iVar7) {
        piVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffee0);
        iVar7 = *piVar12;
        iVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)_expectedPointSize);
        local_359 = iVar8 + -1 <= iVar7;
      }
      local_351 = local_359;
    }
    local_126 = local_351;
    piVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffee0);
    local_365 = true;
    if (0 < *piVar12) {
      piVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffee0);
      iVar7 = *piVar12;
      iVar8 = tcu::Surface::getWidth((Surface *)refPoint_local);
      local_365 = iVar8 + -1 <= iVar7;
    }
    local_127 = local_365;
    if ((((local_125 & 1) != 0) || ((local_126 & 1U) != 0)) || (local_365 != false)) {
      this_local._7_1_ = 1;
      goto LAB_0237c81b;
    }
  }
  iVar7 = *logFloodCounter;
  *logFloodCounter = iVar7 + -1;
  if (-1 < iVar7 + -1) {
    this_01 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_2a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<(&local_2a8,(char (*) [9])"Missing ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&local_40);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2a8224a);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&local_40);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [13])0x2c32754);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(Vector<int,_2> *)viewport_local);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [22])", vertex coordinates=");
    tcu::Vector<float,_2>::swizzle(&local_2b0,(int)bbox_local,0);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_2b0);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2a8);
  }
  this_local._7_1_ = 0;
LAB_0237c81b:
  local_d8 = (undefined1  [4])0x1;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_90);
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
             &widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
             &widthsDownwards.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PointRenderCase::verifyWidePointAt (const tcu::IVec2& pointPos, const tcu::Surface& viewport, const GeneratedPoint& refPoint, const tcu::IVec4& bbox, ResultPointType pointType, int componentNdx, int& logFloodCounter)
{
	const int				expectedPointSize		= refPoint.size;
	bool					viewportClippedTop		= false;
	bool					viewportClippedBottom	= false;
	bool					primitiveClippedTop		= false;
	bool					primitiveClippedBottom	= false;
	std::vector<tcu::IVec2>	widthsUpwards;
	std::vector<tcu::IVec2>	widthsDownwards;
	std::vector<tcu::IVec2>	widths;

	// search upwards
	for (int y = pointPos.y();; --y)
	{
		if (y < bbox.y() || y < 0)
		{
			if (y < bbox.y())
				primitiveClippedTop = true;
			if (y < 0)
				viewportClippedTop = true;
			break;
		}
		else if (pointPos.y() - y > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsUpwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// top is clipped
	if ((viewportClippedTop || (pointType == POINT_PARTIAL && primitiveClippedTop)) && !widthsUpwards.empty())
	{
		const tcu::IVec2&	range			= widthsUpwards.back();
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			widthClipped	= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z());

		if (squareFits || widthClipped)
			return true;
	}

	// and downwards
	for (int y = pointPos.y()+1;; ++y)
	{
		if (y >= bbox.w() || y >= viewport.getHeight())
		{
			if (y >= bbox.w())
				primitiveClippedBottom = true;
			if (y >= viewport.getHeight())
				viewportClippedBottom = true;
			break;
		}
		else if (y - pointPos.y() > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsDownwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// bottom is clipped
	if ((viewportClippedBottom || (pointType == POINT_PARTIAL && primitiveClippedBottom)) && !(widthsDownwards.empty() && widthsUpwards.empty()))
	{
		const tcu::IVec2&	range			= (widthsDownwards.empty()) ? (widthsUpwards.front()) : (widthsDownwards.back());
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			bboxClipped		= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z()-1);
		const bool			viewportClipped	= range.x() <= 0 || range.y() >= viewport.getWidth()-1;

		if (squareFits || bboxClipped || viewportClipped)
			return true;
	}

	// would square point would fit into the rasterized area

	for (int ndx = 0; ndx < (int)widthsUpwards.size(); ++ndx)
		widths.push_back(widthsUpwards[(int)widthsUpwards.size() - ndx - 1]);
	for (int ndx = 0; ndx < (int)widthsDownwards.size(); ++ndx)
		widths.push_back(widthsDownwards[ndx]);
	DE_ASSERT(!widths.empty());

	for (int y = 0; y < (int)widths.size() - expectedPointSize + 1; ++y)
	{
		tcu::IVec2 unionRange = widths[y];

		for (int dy = 1; dy < expectedPointSize; ++dy)
		{
			unionRange.x() = de::max(unionRange.x(), widths[y+dy].x());
			unionRange.y() = de::min(unionRange.y(), widths[y+dy].y());
		}

		// would a N x N block fit here?
		{
			const bool squareFits		= (unionRange.y() - unionRange.x() + 1) >= expectedPointSize;
			const bool bboxClipped		= (pointType == POINT_PARTIAL) && (unionRange.x() <= bbox.x() || unionRange.y() >= bbox.z()-1);
			const bool viewportClipped	= unionRange.x() <= 0 || unionRange.y() >= viewport.getWidth()-1;

			if (squareFits || bboxClipped || viewportClipped)
				return true;
		}
	}

	if (--logFloodCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Missing " << expectedPointSize << "x" << expectedPointSize << " point near " << pointPos << ", vertex coordinates=" << refPoint.center.swizzle(0, 1) << "."
			<< tcu::TestLog::EndMessage;
	}
	return false;
}